

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = pMem1->flags;
  uVar2 = pMem2->flags;
  uVar4 = uVar2 | uVar1;
  if ((uVar4 & 1) != 0) {
    return (uVar2 & 1) - (uVar1 & 1);
  }
  if ((uVar4 & 0x2c) == 0) {
    if ((uVar4 & 2) == 0) {
      uVar7 = pMem1->n;
      uVar3 = pMem2->n;
      uVar1 = pMem1->flags;
      if (((pMem2->flags | uVar1) >> 10 & 1) == 0) {
        uVar8 = uVar3;
        if ((int)uVar7 < (int)uVar3) {
          uVar8 = uVar7;
        }
        iVar6 = memcmp(pMem1->z,pMem2->z,(long)(int)uVar8);
        iVar5 = uVar7 - uVar3;
        if (iVar6 != 0) {
          iVar5 = iVar6;
        }
      }
      else {
        if (((pMem2->flags & uVar1) >> 10 & 1) == 0) {
          if ((uVar1 >> 10 & 1) != 0) {
            if (0 < (int)uVar3) {
              uVar10 = 0;
              do {
                if (pMem2->z[uVar10] != '\0') {
                  return -1;
                }
                uVar10 = uVar10 + 1;
              } while (uVar3 != uVar10);
            }
            return (pMem1->u).nZero - uVar3;
          }
          if (0 < (int)uVar7) {
            uVar10 = 0;
            do {
              if (pMem1->z[uVar10] != '\0') {
                return 1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
          }
        }
        else {
          uVar7 = (pMem1->u).nZero;
        }
        iVar5 = uVar7 - (pMem2->u).nZero;
      }
      return iVar5;
    }
    if ((uVar1 & 2) == 0) {
      return 1;
    }
    if ((uVar2 & 2) == 0) {
      return -1;
    }
    if (pColl != (CollSeq *)0x0) {
      iVar5 = vdbeCompareMemString(pMem1,pMem2,pColl,(u8 *)0x0);
      return iVar5;
    }
    iVar5 = sqlite3BlobCompare(pMem1,pMem2);
    return iVar5;
  }
  if ((uVar2 & uVar1 & 0x24) == 0) {
    if ((uVar2 & uVar1 & 8) != 0) {
      if ((pMem1->u).r < (pMem2->u).r) {
        return -1;
      }
      return (int)((pMem2->u).r < (pMem1->u).r);
    }
    if ((uVar1 & 0x24) == 0) {
      if ((uVar1 & 8) == 0) {
        return 1;
      }
      if ((uVar2 & 0x24) != 0) {
        iVar5 = sqlite3IntFloatCompare((pMem2->u).i,(pMem1->u).r);
        return -iVar5;
      }
      return -1;
    }
    if ((uVar2 & 8) != 0) {
      iVar5 = sqlite3IntFloatCompare((pMem1->u).i,(pMem2->u).r);
      return iVar5;
    }
    if ((uVar2 & 0x24) == 0) {
      return -1;
    }
    lVar9 = (pMem2->u).i;
  }
  else {
    lVar9 = (pMem2->u).i;
  }
  if ((pMem1->u).i < lVar9) {
    return -1;
  }
  return (int)(lVar9 < (pMem1->u).i);
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( !sqlite3VdbeMemIsRowSet(pMem1) && !sqlite3VdbeMemIsRowSet(pMem2) );

  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( combined_flags & MEM_Int );
    testcase( combined_flags & MEM_Real );
    testcase( combined_flags & MEM_IntReal );
    if( (f1 & f2 & (MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & f2 & MEM_Int );
      testcase( f1 & f2 & MEM_IntReal );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&(MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & MEM_Int );
      testcase( f1 & MEM_IntReal );
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        if( pMem1->u.i < pMem2->u.i ) return -1;
        if( pMem1->u.i > pMem2->u.i ) return +1;
        return 0;
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        testcase( f2 & MEM_Int );
        testcase( f2 & MEM_IntReal );
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 ||
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }

  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}